

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

string * __thiscall
google::protobuf::Message::GetTypeName_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  Descriptor *this_00;
  string *psVar1;
  Message *this_local;
  
  this_00 = GetDescriptor(this);
  psVar1 = Descriptor::full_name_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::GetTypeName() const {
  return GetDescriptor()->full_name();
}